

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoled.cxx
# Opt level: O2

int main(void)

{
  uint uVar1;
  result_type rVar2;
  result_type rVar3;
  PressedKey PVar4;
  int iVar5;
  ulong uVar6;
  OledPoint p;
  uniform_int_distribution<int> xDistribution;
  uniform_int_distribution<int> yDistribution;
  LinuxKeys linuxKeys;
  OledI2C oled;
  random_device randomDevice;
  mt19937 randomGenerator;
  
  std::__cxx11::string::string((string *)&randomDevice,"/dev/i2c-1",(allocator *)&randomGenerator);
  SSD1306::OledI2C::OledI2C(&oled,(string *)&randomDevice,'<');
  std::__cxx11::string::~string((string *)&randomDevice);
  randomDevice.field_0.field_0._M_file = (void *)0x1800000020;
  SSD1306::drawString8x16((OledPoint *)&randomDevice,anon_var_dwarf_23d3,Set,&oled.super_OledPixel);
  SSD1306::OledI2C::displayUpdate(&oled);
  LinuxKeys::LinuxKeys(&linuxKeys);
  std::random_device::random_device(&randomDevice);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&randomGenerator,(ulong)uVar1);
  xDistribution._M_param._M_a = 0;
  xDistribution._M_param._M_b = 0x7f;
  yDistribution._M_param._M_a = 0;
  yDistribution._M_param._M_b = 0x3f;
  uVar6 = 0;
  while ((int)uVar6 != 0x1b) {
    PVar4 = LinuxKeys::pressed(&linuxKeys);
    uVar6 = (ulong)PVar4 >> 0x20;
    if (uVar6 == 0x2b) {
      SSD1306::OledI2C::displayOn(&oled);
    }
    else {
      iVar5 = PVar4.key;
      if (iVar5 == 0x2d) {
        SSD1306::OledI2C::displayOff(&oled);
      }
      else if (iVar5 == 0x69) {
        SSD1306::OledI2C::displayInverse(&oled);
      }
      else if (iVar5 == 0x6e) {
        SSD1306::OledI2C::displayNormal(&oled);
      }
    }
    rVar2 = std::uniform_int_distribution<int>::operator()(&xDistribution,&randomGenerator);
    rVar3 = std::uniform_int_distribution<int>::operator()(&yDistribution,&randomGenerator);
    p.m_y = rVar3;
    p.m_x = rVar2;
    SSD1306::OledI2C::xorPixel(&oled,p);
    SSD1306::OledI2C::displayUpdate(&oled);
  }
  SSD1306::OledI2C::clear(&oled);
  SSD1306::OledI2C::displayUpdate(&oled);
  std::random_device::~random_device(&randomDevice);
  LinuxKeys::~LinuxKeys(&linuxKeys);
  SSD1306::OledI2C::~OledI2C(&oled);
  return 0;
}

Assistant:

int
main()
{
    try
    {
        SSD1306::OledI2C oled{"/dev/i2c-1", 0x3C};
        drawString8x16(SSD1306::OledPoint{32, 24},
                       "Oled I" "\xFD" "C",
                       SSD1306::PixelStyle::Set,
                       oled);
        oled.displayUpdate();

        //-----------------------------------------------------------------

        LinuxKeys linuxKeys;
        LinuxKeys::PressedKey key;

        //-----------------------------------------------------------------


        std::random_device randomDevice;
        std::mt19937 randomGenerator{randomDevice()};
        std::uniform_int_distribution<> xDistribution{0, oled.width() - 1};
        std::uniform_int_distribution<> yDistribution{0, oled.height() - 1};


        //-----------------------------------------------------------------

        while(key.key != 27)
        {
            key = linuxKeys.pressed();

            switch (key.key)
            {
            case 'i':

                oled.displayInverse();

                break;

            case 'n':

                oled.displayNormal();

                break;

            case '+':

                oled.displayOn();

                break;

            case '-':

                oled.displayOff();

                break;
            }

            SSD1306::OledPoint p{xDistribution(randomGenerator),
                                 yDistribution(randomGenerator)};

            oled.xorPixel(p);
            oled.displayUpdate();
        }

        oled.clear();
        oled.displayUpdate();
    }
    catch (std::exception& e)
    {
        std::cerr << e.what() << "\n";
    }

    return 0;
}